

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall
sqvector<SQClassMember>::resize
          (sqvector<SQClassMember> *this,SQUnsignedInteger newsize,SQClassMember *fill)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQClassMember *pSVar3;
  ulong uVar4;
  long lVar5;
  SQUnsignedInteger SVar6;
  
  if (this->_allocated < newsize) {
    pSVar3 = (SQClassMember *)sq_vm_realloc(this->_vals,this->_allocated << 5,newsize << 5);
    this->_vals = pSVar3;
    this->_allocated = newsize;
  }
  uVar4 = this->_size;
  if (uVar4 < newsize) {
    do {
      pSVar3 = this->_vals;
      SVar2 = (fill->val).super_SQObject._type;
      pSVar3[uVar4].val.super_SQObject._type = SVar2;
      pSVar3[uVar4].val.super_SQObject._unVal = (fill->val).super_SQObject._unVal;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &((pSVar3[uVar4].val.super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SVar2 = (fill->attrs).super_SQObject._type;
      pSVar3[uVar4].attrs.super_SQObject._type = SVar2;
      pSVar3[uVar4].attrs.super_SQObject._unVal = (fill->attrs).super_SQObject._unVal;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &((pSVar3[uVar4].attrs.super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      uVar4 = this->_size + 1;
      this->_size = uVar4;
    } while (uVar4 < newsize);
  }
  else {
    if (newsize < uVar4) {
      lVar5 = newsize << 5;
      SVar6 = newsize;
      do {
        pSVar3 = this->_vals;
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar3->attrs).super_SQObject._type + lVar5));
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar3->val).super_SQObject._type + lVar5));
        SVar6 = SVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (SVar6 < this->_size);
    }
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }